

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O3

int utf8casecmp(void *src1,void *src2)

{
  long lVar1;
  byte bVar2;
  uchar *s2;
  uchar *s1;
  byte bVar3;
  byte bVar4;
  
  bVar3 = *src1;
  bVar2 = *src2;
  if (bVar3 != 0 || bVar2 != 0) {
    lVar1 = 1;
    do {
      bVar4 = bVar3 | 0x20;
      if (0x19 < (byte)(bVar3 + 0xbf)) {
        bVar4 = bVar3;
      }
      bVar3 = bVar2 | 0x20;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        bVar3 = bVar2;
      }
      if (bVar4 < bVar3) {
        return -1;
      }
      if (bVar3 < bVar4) {
        return 1;
      }
      bVar3 = *(byte *)((long)src1 + lVar1);
      bVar2 = *(byte *)((long)src2 + lVar1);
      lVar1 = lVar1 + 1;
    } while (bVar2 != 0 || bVar3 != 0);
  }
  return 0;
}

Assistant:

int utf8casecmp(const void *src1, const void *src2) {
  const unsigned char *s1 = (const unsigned char *)src1;
  const unsigned char *s2 = (const unsigned char *)src2;

  while (('\0' != *s1) || ('\0' != *s2)) {
    unsigned char a = *s1;
    unsigned char b = *s2;

    if (('A' <= a) && ('Z' >= a)) {
      a |= 0x20; // make a lowercase
    }

    if (('A' <= b) && ('Z' >= b)) {
      b |= 0x20; // make b lowercase
    }

    if (a < b) {
      return -1;
    } else if (a > b) {
      return 1;
    }

    s1++;
    s2++;
  }

  // both utf8 strings matched
  return 0;
}